

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Driver.cpp
# Opt level: O2

bool __thiscall
slang::driver::Driver::processCommandFiles
          (Driver *this,string_view pattern,bool makeRelative,bool separateUnit)

{
  group_type_pointer pgVar1;
  flat_hash_set<std::filesystem::path> *this_00;
  group_type_pointer pgVar2;
  value_type_pointer ppVar3;
  ulong uVar4;
  uint uVar5;
  uchar uVar6;
  uchar uVar7;
  uchar uVar8;
  byte bVar9;
  bool bVar10;
  byte bVar11;
  bool bVar12;
  uint uVar13;
  size_t sVar14;
  ulong uVar15;
  pointer path;
  ulong pos0;
  path *ppVar16;
  long lVar17;
  ulong uVar18;
  path *message;
  anon_union_8_2_de49483c_for_basic_format_args<fmt::v11::context>_2 aVar19;
  undefined1 auVar20 [16];
  undefined1 auVar21 [16];
  error_code eVar22;
  format_args args;
  format_args args_00;
  format_args args_01;
  string_view text;
  string_view argList;
  string_view pattern_00;
  string_view fmt;
  string_view fmt_00;
  string_view fmt_01;
  error_code *in_stack_fffffffffffffe10;
  path currPath;
  error_code ec;
  SmallVector<char,_40UL> buffer;
  path local_108;
  path *local_d8;
  error_category *local_d0;
  error_code globEc;
  SmallVector<std::filesystem::__cxx11::path,_2UL> files;
  
  pattern_00._M_len = pattern._M_str;
  ppVar16 = (path *)pattern._M_len;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ =
       (pointer)files.super_SmallVectorBase<std::filesystem::__cxx11::path>.firstElement;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len = 0;
  files.super_SmallVectorBase<std::filesystem::__cxx11::path>.cap = 2;
  globEc._M_value = 0;
  local_d0 = (error_category *)std::_V2::system_category();
  globEc._M_cat = local_d0;
  std::filesystem::__cxx11::path::path((path *)&buffer);
  aVar19.values_ = (value<fmt::v11::context> *)0x0;
  pattern_00._M_str = (char *)0x0;
  message = ppVar16;
  svGlob((slang *)&buffer,ppVar16,pattern_00,(GlobMode)&files,
         (SmallVector<std::filesystem::__cxx11::path,_2UL> *)0x0,SUB81(&globEc,0),
         in_stack_fffffffffffffe10);
  std::filesystem::__cxx11::path::~path((path *)&buffer);
  if (globEc._M_value == 0) {
    local_d8 = files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_ +
               files.super_SmallVectorBase<std::filesystem::__cxx11::path>.len;
    this_00 = &this->activeCommandFiles;
    for (path = files.super_SmallVectorBase<std::filesystem::__cxx11::path>.data_; path != local_d8;
        path = path + 1) {
      buffer.super_SmallVectorBase<char>.len = 0;
      buffer.super_SmallVectorBase<char>.cap = 0x28;
      buffer.super_SmallVectorBase<char>.data_ = buffer.super_SmallVectorBase<char>.firstElement;
      eVar22 = OS::readFile(path,&buffer);
      if (eVar22._M_value != 0) {
        (**(code **)(*(long *)eVar22._M_cat + 0x20))(&ec,eVar22._M_cat,eVar22._M_value);
        currPath._M_pathname._M_dataplus._M_p = (path->_M_pathname)._M_dataplus._M_p;
        currPath._M_pathname._M_string_length = (path->_M_pathname)._M_string_length;
        currPath._M_pathname.field_2._M_allocated_capacity = CONCAT44(ec._4_4_,ec._M_value);
        currPath._M_pathname.field_2._8_8_ = ec._M_cat;
        args_01.field_1.args_ = aVar19.args_;
        args_01.desc_ = (unsigned_long_long)&currPath;
        fmt_01.size_ = 0xdd;
        fmt_01.data_ = (char *)0x15;
        ::fmt::v11::vformat_abi_cxx11_
                  (&local_108._M_pathname,(v11 *)"command file \'{}\': {}",fmt_01,args_01);
        message = &local_108;
        printError(this,&message->_M_pathname);
        std::__cxx11::string::~string((string *)&local_108);
        ppVar16 = (path *)&ec;
LAB_00532bb4:
        std::__cxx11::string::~string((string *)ppVar16);
        this->anyFailedLoads = true;
LAB_00532bc2:
        SmallVectorBase<char>::cleanup(&buffer.super_SmallVectorBase<char>,(EVP_PKEY_CTX *)message);
        goto LAB_00532bcf;
      }
      sVar14 = boost::unordered::detail::foa::mulx_mix::
               mix<slang::hash<std::filesystem::__cxx11::path,void>,std::filesystem::__cxx11::path>
                         ((hash<std::filesystem::__cxx11::path,_void> *)this_00,path);
      pos0 = sVar14 >> ((byte)(this_00->table_).
                              super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                              .arrays.groups_size_index & 0x3f);
      lVar17 = (sVar14 & 0xff) * 4;
      uVar6 = (&UNK_007e24cc)[lVar17];
      uVar7 = (&UNK_007e24cd)[lVar17];
      uVar8 = (&UNK_007e24ce)[lVar17];
      bVar9 = (&UNK_007e24cf)[lVar17];
      uVar15 = 0;
      uVar18 = pos0;
      do {
        pgVar2 = (this->activeCommandFiles).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                 .arrays.groups_;
        pgVar1 = pgVar2 + uVar18;
        bVar11 = pgVar1->m[0xf].n;
        auVar20[0] = -(pgVar1->m[0].n == uVar6);
        auVar20[1] = -(pgVar1->m[1].n == uVar7);
        auVar20[2] = -(pgVar1->m[2].n == uVar8);
        auVar20[3] = -(pgVar1->m[3].n == bVar9);
        auVar20[4] = -(pgVar1->m[4].n == uVar6);
        auVar20[5] = -(pgVar1->m[5].n == uVar7);
        auVar20[6] = -(pgVar1->m[6].n == uVar8);
        auVar20[7] = -(pgVar1->m[7].n == bVar9);
        auVar20[8] = -(pgVar1->m[8].n == uVar6);
        auVar20[9] = -(pgVar1->m[9].n == uVar7);
        auVar20[10] = -(pgVar1->m[10].n == uVar8);
        auVar20[0xb] = -(pgVar1->m[0xb].n == bVar9);
        auVar20[0xc] = -(pgVar1->m[0xc].n == uVar6);
        auVar20[0xd] = -(pgVar1->m[0xd].n == uVar7);
        auVar20[0xe] = -(pgVar1->m[0xe].n == uVar8);
        auVar20[0xf] = -(bVar11 == bVar9);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar20 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar20 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar20 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar20 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar20 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar20 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar20 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar20 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar20 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar20 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar20 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar20 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar20 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar20 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar20 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          ppVar3 = (this->activeCommandFiles).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   .arrays.elements_;
          do {
            uVar5 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            bVar10 = std::filesystem::__cxx11::operator==(path,ppVar3 + uVar18 * 0xf + (ulong)uVar5)
            ;
            if (bVar10) {
              local_108._M_pathname._M_dataplus._M_p = (path->_M_pathname)._M_dataplus._M_p;
              local_108._M_pathname._M_string_length = (path->_M_pathname)._M_string_length;
              args_00.field_1.args_ = aVar19.args_;
              args_00.desc_ = (unsigned_long_long)&local_108;
              fmt_00.size_ = 0xd;
              fmt_00.data_ = (char *)0x2d;
              ::fmt::v11::vformat_abi_cxx11_
                        (&currPath._M_pathname,
                         (v11 *)"command file \'{}\' includes itself recursively",fmt_00,args_00);
              message = &currPath;
              printError(this,&message->_M_pathname);
              ppVar16 = &currPath;
              goto LAB_00532bb4;
            }
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
          bVar11 = pgVar2[uVar18].m[0xf].n;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)sVar14 & 7] & bVar11) == 0) break;
        uVar4 = (this->activeCommandFiles).table_.
                super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                .arrays.groups_size_mask;
        lVar17 = uVar18 + uVar15;
        uVar15 = uVar15 + 1;
        uVar18 = lVar17 + 1U & uVar4;
      } while (uVar15 <= uVar4);
      if ((this->activeCommandFiles).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          .size_ctrl.size <
          (this->activeCommandFiles).table_.
          super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
          .size_ctrl.ml) {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
        ::unchecked_emplace_at<std::filesystem::__cxx11::path_const&>
                  ((locator *)&currPath,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
                    *)this_00,pos0,sVar14,path);
      }
      else {
        boost::unordered::detail::foa::
        table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
        ::unchecked_emplace_with_rehash<std::filesystem::__cxx11::path_const&>
                  ((locator *)&currPath,
                   (table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,boost::unordered::detail::foa::table_arrays,boost::unordered::detail::foa::plain_size_control,slang::hash<std::filesystem::__cxx11::path,void>,std::equal_to<std::filesystem::__cxx11::path>,std::allocator<std::filesystem::__cxx11::path>>
                    *)this_00,sVar14,path);
      }
      std::filesystem::__cxx11::path::path(&currPath);
      ec._M_value = 0;
      ec._M_cat = local_d0;
      if (makeRelative) {
        std::filesystem::current_path_abi_cxx11_((error_code *)&local_108);
        std::filesystem::__cxx11::path::operator=(&currPath,&local_108);
        std::filesystem::__cxx11::path::~path(&local_108);
        std::filesystem::__cxx11::path::parent_path();
        std::filesystem::current_path(&local_108,&ec);
        std::filesystem::__cxx11::path::~path(&local_108);
      }
      text._M_len = buffer.super_SmallVectorBase<char>.len - 1;
      buffer.super_SmallVectorBase<char>.len = text._M_len;
      if (separateUnit) {
        text._M_str = buffer.super_SmallVectorBase<char>.data_;
        bVar10 = parseUnitListing(this,text);
      }
      else {
        argList._M_str = buffer.super_SmallVectorBase<char>.data_;
        argList._M_len = text._M_len;
        bVar10 = parseCommandLine(this,argList,(ParseOptions)0x1010101);
      }
      if (makeRelative) {
        std::filesystem::current_path(&currPath,&ec);
      }
      sVar14 = boost::unordered::detail::foa::mulx_mix::
               mix<slang::hash<std::filesystem::__cxx11::path,void>,std::filesystem::__cxx11::path>
                         ((hash<std::filesystem::__cxx11::path,_void> *)this_00,path);
      message = (path *)(sVar14 >>
                        ((byte)(this_00->table_).
                               super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                               .arrays.groups_size_index & 0x3f));
      lVar17 = (sVar14 & 0xff) * 4;
      uVar6 = (&UNK_007e24cc)[lVar17];
      uVar7 = (&UNK_007e24cd)[lVar17];
      uVar8 = (&UNK_007e24ce)[lVar17];
      bVar9 = (&UNK_007e24cf)[lVar17];
      uVar18 = 0;
      do {
        pgVar2 = (this->activeCommandFiles).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                 .arrays.groups_;
        pgVar1 = pgVar2 + (long)message;
        bVar11 = pgVar1->m[0xf].n;
        auVar21[0] = -(pgVar1->m[0].n == uVar6);
        auVar21[1] = -(pgVar1->m[1].n == uVar7);
        auVar21[2] = -(pgVar1->m[2].n == uVar8);
        auVar21[3] = -(pgVar1->m[3].n == bVar9);
        auVar21[4] = -(pgVar1->m[4].n == uVar6);
        auVar21[5] = -(pgVar1->m[5].n == uVar7);
        auVar21[6] = -(pgVar1->m[6].n == uVar8);
        auVar21[7] = -(pgVar1->m[7].n == bVar9);
        auVar21[8] = -(pgVar1->m[8].n == uVar6);
        auVar21[9] = -(pgVar1->m[9].n == uVar7);
        auVar21[10] = -(pgVar1->m[10].n == uVar8);
        auVar21[0xb] = -(pgVar1->m[0xb].n == bVar9);
        auVar21[0xc] = -(pgVar1->m[0xc].n == uVar6);
        auVar21[0xd] = -(pgVar1->m[0xd].n == uVar7);
        auVar21[0xe] = -(pgVar1->m[0xe].n == uVar8);
        auVar21[0xf] = -(bVar11 == bVar9);
        uVar13 = (uint)(ushort)((ushort)(SUB161(auVar21 >> 7,0) & 1) |
                                (ushort)(SUB161(auVar21 >> 0xf,0) & 1) << 1 |
                                (ushort)(SUB161(auVar21 >> 0x17,0) & 1) << 2 |
                                (ushort)(SUB161(auVar21 >> 0x1f,0) & 1) << 3 |
                                (ushort)(SUB161(auVar21 >> 0x27,0) & 1) << 4 |
                                (ushort)(SUB161(auVar21 >> 0x2f,0) & 1) << 5 |
                                (ushort)(SUB161(auVar21 >> 0x37,0) & 1) << 6 |
                                (ushort)(SUB161(auVar21 >> 0x3f,0) & 1) << 7 |
                                (ushort)(SUB161(auVar21 >> 0x47,0) & 1) << 8 |
                                (ushort)(SUB161(auVar21 >> 0x4f,0) & 1) << 9 |
                                (ushort)(SUB161(auVar21 >> 0x57,0) & 1) << 10 |
                                (ushort)(SUB161(auVar21 >> 0x5f,0) & 1) << 0xb |
                                (ushort)(SUB161(auVar21 >> 0x67,0) & 1) << 0xc |
                                (ushort)(SUB161(auVar21 >> 0x6f,0) & 1) << 0xd |
                               (ushort)(SUB161(auVar21 >> 0x77,0) & 1) << 0xe);
        if (uVar13 != 0) {
          ppVar3 = (this->activeCommandFiles).table_.
                   super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                   .arrays.elements_;
          do {
            uVar5 = 0;
            if (uVar13 != 0) {
              for (; (uVar13 >> uVar5 & 1) == 0; uVar5 = uVar5 + 1) {
              }
            }
            ppVar16 = ppVar3 + (long)message * 0xf + (ulong)uVar5;
            bVar12 = std::filesystem::__cxx11::operator==(path,ppVar16);
            if (bVar12) {
              message = (path *)(pgVar2[(long)message].m + uVar5);
              std::filesystem::__cxx11::path::~path(ppVar16);
              boost::unordered::detail::foa::
              table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
              ::recover_slot((table_core<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>,_boost::unordered::detail::foa::table_arrays,_boost::unordered::detail::foa::plain_size_control,_slang::hash<std::filesystem::__cxx11::path,_void>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                              *)this_00,(uchar *)message);
              goto LAB_00532b0c;
            }
            uVar13 = uVar13 - 1 & uVar13;
          } while (uVar13 != 0);
          bVar11 = pgVar2[(long)message].m[0xf].n;
        }
        if (((&boost::unordered::detail::foa::group15<boost::unordered::detail::foa::plain_integral>
               ::is_not_overflowed(unsigned_long)::shift)[(uint)sVar14 & 7] & bVar11) == 0) break;
        uVar15 = (this->activeCommandFiles).table_.
                 super_table_core_impl<boost::unordered::detail::foa::flat_set_types<std::filesystem::__cxx11::path>,_slang::hash<std::filesystem::__cxx11::path>,_std::equal_to<std::filesystem::__cxx11::path>,_std::allocator<std::filesystem::__cxx11::path>_>
                 .arrays.groups_size_mask;
        lVar17 = uVar18 + 1;
        uVar18 = uVar18 + 1;
        message = (path *)((long)&(message->_M_pathname)._M_dataplus._M_p + lVar17 & uVar15);
      } while (uVar18 <= uVar15);
LAB_00532b0c:
      if (bVar10 == false) {
        this->anyFailedLoads = true;
        std::filesystem::__cxx11::path::~path(&currPath);
        goto LAB_00532bc2;
      }
      std::filesystem::__cxx11::path::~path(&currPath);
      SmallVectorBase<char>::cleanup(&buffer.super_SmallVectorBase<char>,(EVP_PKEY_CTX *)message);
    }
    bVar10 = true;
  }
  else {
    (**(code **)(*(long *)globEc._M_cat + 0x20))(&local_108);
    buffer.super_SmallVectorBase<char>.cap = (size_type)local_108._M_pathname._M_dataplus._M_p;
    buffer.super_SmallVectorBase<char>._24_8_ = local_108._M_pathname._M_string_length;
    args.field_1.values_ = aVar19.values_;
    args.desc_ = (unsigned_long_long)&buffer;
    fmt.size_ = 0xdd;
    fmt.data_ = (char *)0x15;
    buffer.super_SmallVectorBase<char>.data_ = pattern_00._M_len;
    buffer.super_SmallVectorBase<char>.len = (size_type)ppVar16;
    ::fmt::v11::vformat_abi_cxx11_(&currPath._M_pathname,(v11 *)"command file \'{}\': {}",fmt,args);
    message = &currPath;
    printError(this,&message->_M_pathname);
    std::__cxx11::string::~string((string *)&currPath);
    std::__cxx11::string::~string((string *)&local_108);
    this->anyFailedLoads = true;
LAB_00532bcf:
    bVar10 = false;
  }
  SmallVectorBase<std::filesystem::__cxx11::path>::cleanup
            (&files.super_SmallVectorBase<std::filesystem::__cxx11::path>,(EVP_PKEY_CTX *)message);
  return bVar10;
}

Assistant:

bool Driver::processCommandFiles(std::string_view pattern, bool makeRelative, bool separateUnit) {
    auto onError = [this](const auto& name, std::error_code ec) {
        printError(fmt::format("command file '{}': {}", name, ec.message()));
        anyFailedLoads = true;
        return false;
    };

    SmallVector<fs::path> files;
    std::error_code globEc;
    svGlob({}, pattern, GlobMode::Files, files, /* expandEnvVars */ false, globEc);
    if (globEc)
        return onError(pattern, globEc);

    for (auto& path : files) {
        SmallVector<char> buffer;
        if (auto readEc = OS::readFile(path, buffer))
            return onError(getU8Str(path), readEc);

        if (!activeCommandFiles.insert(path).second) {
            printError(
                fmt::format("command file '{}' includes itself recursively", getU8Str(path)));
            anyFailedLoads = true;
            return false;
        }

        fs::path currPath;
        std::error_code ec;
        if (makeRelative) {
            currPath = fs::current_path(ec);
            fs::current_path(path.parent_path(), ec);
        }

        SLANG_ASSERT(!buffer.empty());
        buffer.pop_back();
        std::string_view argStr(buffer.data(), buffer.size());

        bool result;
        if (separateUnit) {
            result = parseUnitListing(argStr);
        }
        else {
            CommandLine::ParseOptions parseOpts;
            parseOpts.expandEnvVars = true;
            parseOpts.ignoreProgramName = true;
            parseOpts.supportComments = true;
            parseOpts.ignoreDuplicates = true;
            result = parseCommandLine(argStr, parseOpts);
        }

        if (makeRelative)
            fs::current_path(currPath, ec);

        activeCommandFiles.erase(path);

        if (!result) {
            anyFailedLoads = true;
            return false;
        }
    }

    return true;
}